

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineAlgo.cpp
# Opt level: O3

void anon_unknown.dwarf_988cd::testIntersect
               (Line3f *line,V3f *v0,V3f *v1,V3f *v2,V3f *point,bool front,bool returnValue)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  bool fr;
  V3f bary;
  V3f pt;
  bool local_59;
  Vec3<float> local_58;
  Vec3<float> local_4c;
  undefined8 local_40;
  float local_38;
  
  bVar10 = Imath_3_2::intersect<float>(line,v0,v1,v2,&local_4c,&local_58,&local_59);
  if (bVar10 != returnValue) {
    __assert_fail("rv == returnValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0x9d,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  if (!bVar10) {
    return;
  }
  if (local_59 != front) {
    __assert_fail("front == fr",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0xa3,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  fVar13 = point->x;
  if ((float)(~-(uint)(fVar13 < local_4c.x) & (uint)(fVar13 - local_4c.x) |
             (uint)(local_4c.x - fVar13) & -(uint)(fVar13 < local_4c.x)) <= 1.1920929e-06) {
    uVar9 = 0;
    do {
      uVar11 = uVar9;
      if (uVar11 == 2) goto LAB_0013e029;
      fVar13 = (&local_4c.y)[uVar11];
      fVar1 = (&point->y)[uVar11];
      uVar9 = uVar11 + 1;
    } while ((float)(~-(uint)(fVar1 < fVar13) & (uint)(fVar1 - fVar13) |
                    (uint)(fVar13 - fVar1) & -(uint)(fVar1 < fVar13)) <= 1.1920929e-06);
    if (1 < uVar11) {
LAB_0013e029:
      uVar2 = v0->x;
      uVar5 = v0->y;
      uVar3 = v1->x;
      uVar6 = v1->y;
      uVar4 = v2->x;
      uVar7 = v2->y;
      fVar13 = local_58.z * (float)uVar4 + local_58.y * (float)uVar3 + local_58.x * (float)uVar2;
      local_40 = CONCAT44(local_58.z * (float)uVar7 +
                          local_58.y * (float)uVar6 + local_58.x * (float)uVar5,fVar13);
      local_38 = v2->z * local_58.z + v1->z * local_58.y + v0->z * local_58.x;
      if ((float)(~-(uint)(fVar13 < local_4c.x) & (uint)(fVar13 - local_4c.x) |
                 (uint)(local_4c.x - fVar13) & -(uint)(fVar13 < local_4c.x)) <= 1.1920929e-06) {
        lVar8 = 1;
        do {
          lVar12 = lVar8;
          if (lVar12 == 3) {
            return;
          }
          fVar13 = (&local_4c.x)[lVar12];
          fVar1 = *(float *)((long)&local_40 + lVar12 * 4);
          lVar8 = lVar12 + 1;
        } while ((float)(~-(uint)(fVar1 < fVar13) & (uint)(fVar1 - fVar13) |
                        (uint)(fVar13 - fVar1) & -(uint)(fVar1 < fVar13)) <= 1.1920929e-06);
        if (1 < lVar12 - 1U) {
          return;
        }
      }
      __assert_fail("pt.equalWithAbsError (pt2, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
  }
  __assert_fail("pt.equalWithAbsError (point, e)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                ,0xa4,
                "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
               );
}

Assistant:

void
testIntersect (
    const Line3f& line,
    const V3f&    v0,
    const V3f&    v1,
    const V3f&    v2,
    const V3f&    point,
    bool          front,
    bool          returnValue)
{
    V3f  pt;
    V3f  bary;
    bool fr;

    bool rv = intersect (line, v0, v1, v2, pt, bary, fr);

    assert (rv == returnValue);

    float e = 10 * std::numeric_limits<float>::epsilon ();

    if (rv)
    {
        assert (front == fr);
        assert (pt.equalWithAbsError (point, e));
        V3f pt2 = v0 * bary.x + v1 * bary.y + v2 * bary.z;
        assert (pt.equalWithAbsError (pt2, e));
    }
}